

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_862632::X509Test_DirHashThreads_Test::TestBody
          (X509Test_DirHashThreads_Test *this)

{
  pointer ptVar1;
  pointer ptVar2;
  bool bVar3;
  int iVar4;
  allocator_type *paVar5;
  size_type sVar6;
  pointer ptVar7;
  thread *ptVar8;
  anon_class_16_2_e7b7d2c5_for__M_head_impl *extraout_RDX;
  anon_class_16_2_e7b7d2c5_for__M_head_impl *__args;
  anon_class_16_2_e7b7d2c5_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_e7b7d2c5_for__M_head_impl *__args_00;
  anon_class_16_2_e7b7d2c5_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_e7b7d2c5_for__M_head_impl *__args_01;
  anon_class_16_2_e7b7d2c6_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_e7b7d2c5_for__M_head_impl *__args_02;
  anon_class_16_2_e7b7d2c6_for__M_head_impl *extraout_RDX_03;
  anon_class_16_2_e7b7d2c6_for__M_head_impl *__args_03;
  anon_class_16_2_e7b7d2c6_for__M_head_impl *extraout_RDX_04;
  anon_class_16_2_e7b7d2c6_for__M_head_impl *__args_04;
  anon_class_16_2_e7b7d2c6_for__M_head_impl *extraout_RDX_05;
  anon_class_16_2_e7b7d2c6_for__M_head_impl *__args_05;
  anon_class_16_2_c3e0be2d_for__M_head_impl *extraout_RDX_06;
  anon_class_16_2_e7b7d2c6_for__M_head_impl *__args_06;
  anon_class_16_2_c3e0be2d_for__M_head_impl *extraout_RDX_07;
  anon_class_16_2_c3e0be2d_for__M_head_impl *__args_07;
  anon_class_16_2_c3e0be2d_for__M_head_impl *extraout_RDX_08;
  anon_class_16_2_c3e0be2d_for__M_head_impl *__args_08;
  anon_class_16_2_c3e0be2d_for__M_head_impl *extraout_RDX_09;
  anon_class_16_2_c3e0be2d_for__M_head_impl *__args_09;
  anon_class_16_2_c3e0be2e_for__M_head_impl *extraout_RDX_10;
  anon_class_16_2_c3e0be2d_for__M_head_impl *__args_10;
  anon_class_16_2_c3e0be2e_for__M_head_impl *extraout_RDX_11;
  anon_class_16_2_c3e0be2e_for__M_head_impl *__args_11;
  anon_class_16_2_c3e0be2e_for__M_head_impl *extraout_RDX_12;
  anon_class_16_2_c3e0be2e_for__M_head_impl *__args_12;
  anon_class_16_2_c3e0be2e_for__M_head_impl *extraout_RDX_13;
  anon_class_16_2_c3e0be2e_for__M_head_impl *__args_13;
  anon_class_16_2_e7b7d2c5_for__M_head_impl *extraout_RDX_14;
  anon_class_16_2_c3e0be2e_for__M_head_impl *__args_14;
  anon_class_16_2_e7b7d2c5_for__M_head_impl *extraout_RDX_15;
  thread *thread;
  pointer ptVar9;
  size_type *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar10;
  char *in_R9;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  AssertionResult gtest_ar__10;
  UniquePtr<X509> old_leaf1;
  UniquePtr<X509> old_leaf2;
  anon_class_8_1_a8a4e801 verify;
  string old_ca1;
  UniquePtr<X509_STORE> store;
  string old_ca2;
  AssertHelper local_178;
  anon_class_16_2_441bd9f7 add_crl;
  anon_class_8_1_ba1d59bf issue_cert;
  string ca1;
  UniquePtr<X509> leaf2;
  UniquePtr<X509> leaf1;
  string ca2;
  anon_class_16_2_441bd9f7 add_root;
  UniquePtr<EVP_PKEY> key;
  long local_f0;
  TemporaryHashDir dir;
  
  bVar3 = bssl::SkipTempFileTests();
  if (bVar3) {
    testing::Message::Message((Message *)&dir);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ca1,kSkip,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20ad,"");
    testing::internal::AssertHelper::operator=((AssertHelper *)&ca1,(Message *)&dir);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ca1);
    if (dir._0_8_ == 0) {
      return;
    }
    (**(code **)(*(long *)dir._0_8_ + 8))();
    return;
  }
  PrivateKeyFromPEM((anon_unknown_dwarf_862632 *)&key,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  ca1._M_string_length = 0;
  ca1._M_dataplus._M_p._0_1_ =
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&ca2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&dir,(internal *)&ca1,(AssertionResult *)0x55f7b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&old_ca1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20b1,(char *)dir._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&old_ca1,(Message *)&ca2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&old_ca1);
    std::__cxx11::string::~string((string *)&dir);
    if ((long *)CONCAT71(ca2._M_dataplus._M_p._1_7_,ca2._M_dataplus._M_p._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(ca2._M_dataplus._M_p._1_7_,ca2._M_dataplus._M_p._0_1_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ca1._M_string_length);
    goto LAB_00398b40;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ca1._M_string_length);
  TemporaryHashDir::TemporaryHashDir(&dir,1);
  ca2._M_dataplus._M_p._0_1_ = bssl::TemporaryDirectory::Init(&dir.dir_);
  ca2._M_string_length = 0;
  if ((bool)ca2._M_dataplus._M_p._0_1_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ca2._M_string_length);
    add_crl.key = &key;
    add_crl.dir = &dir;
    issue_cert.key = &key;
    add_root.key = &key;
    add_root.dir = &dir;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ca1,"Test CA 1191514847",(allocator<char> *)&ca2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ca2,"Test CA 1570301806",(allocator<char> *)&old_ca1);
    bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_root,&ca1,kNewHash);
    old_ca2._M_dataplus._M_p._0_1_ = bVar3;
    old_ca2._M_string_length = 0;
    if (bVar3) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&old_ca2._M_string_length);
      bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_root,&ca2,kNewHash);
      old_ca2._M_dataplus._M_p._0_1_ = bVar3;
      old_ca2._M_string_length = 0;
      if (!bVar3) {
        testing::Message::Message((Message *)&threads);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&old_ca1,(internal *)&old_ca2,(AssertionResult *)"add_root(ca2, kNewHash)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20d7,(char *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,
                                            (char)old_ca1._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__10,(Message *)&threads);
        goto LAB_00398aed;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&old_ca2._M_string_length);
      bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_crl,&ca1,-2,kNewHash);
      old_ca2._M_dataplus._M_p._0_1_ = bVar3;
      old_ca2._M_string_length = 0;
      if (!bVar3) {
        testing::Message::Message((Message *)&threads);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&old_ca1,(internal *)&old_ca2,(AssertionResult *)"add_crl(ca1, -2, kNewHash)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20d8,(char *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,
                                            (char)old_ca1._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__10,(Message *)&threads);
        goto LAB_00398aed;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&old_ca2._M_string_length);
      bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_crl,&ca2,-1,kNewHash);
      old_ca2._M_dataplus._M_p._0_1_ = bVar3;
      old_ca2._M_string_length = 0;
      if (!bVar3) {
        testing::Message::Message((Message *)&threads);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&old_ca1,(internal *)&old_ca2,(AssertionResult *)"add_crl(ca2, -1, kNewHash)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20d9,(char *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,
                                            (char)old_ca1._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__10,(Message *)&threads);
        goto LAB_00398aed;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&old_ca2._M_string_length);
      bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_crl,&ca2,-2,kNewHash);
      old_ca2._M_dataplus._M_p._0_1_ = bVar3;
      old_ca2._M_string_length = 0;
      if (!bVar3) {
        testing::Message::Message((Message *)&threads);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&old_ca1,(internal *)&old_ca2,(AssertionResult *)"add_crl(ca2, -2, kNewHash)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20da,(char *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,
                                            (char)old_ca1._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__10,(Message *)&threads);
        goto LAB_00398aed;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&old_ca2._M_string_length);
      bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_crl,&ca1,-1,kNewHash);
      old_ca2._M_dataplus._M_p._0_1_ = bVar3;
      old_ca2._M_string_length = 0;
      if (!bVar3) {
        testing::Message::Message((Message *)&threads);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&old_ca1,(internal *)&old_ca2,(AssertionResult *)"add_crl(ca1, -1, kNewHash)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20db,(char *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,
                                            (char)old_ca1._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__10,(Message *)&threads);
        goto LAB_00398aed;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&old_ca2._M_string_length);
      old_ca2._M_dataplus._M_p =
           (pointer)dir.next_cert_._M_t._M_impl.super__Rb_tree_header._M_node_count;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,1);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&old_ca1,"dir.num_cert_hashes()","1u",(unsigned_long *)&old_ca2,
                 (uint *)&threads);
      if ((char)old_ca1._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&old_ca2);
        if (old_ca1._M_string_length == 0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)old_ca1._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&threads,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20dd,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&threads,(Message *)&old_ca2);
LAB_00398c96:
        this_00 = &old_ca1._M_string_length;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&threads);
        if (old_ca2._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)old_ca2._M_dataplus._M_p + 8))();
        }
        goto LAB_00398b14;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&old_ca1._M_string_length);
      old_ca2._M_dataplus._M_p =
           (pointer)dir.next_crl_._M_t._M_impl.super__Rb_tree_header._M_node_count;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,1);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&old_ca1,"dir.num_crl_hashes()","1u",(unsigned_long *)&old_ca2,
                 (uint *)&threads);
      if ((char)old_ca1._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&old_ca2);
        if (old_ca1._M_string_length == 0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)old_ca1._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&threads,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20de,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&threads,(Message *)&old_ca2);
        goto LAB_00398c96;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&old_ca1._M_string_length);
      TestBody::anon_class_8_1_ba1d59bf::operator()
                ((anon_class_8_1_ba1d59bf *)&leaf1,(string *)&issue_cert);
      old_ca2._M_string_length = 0;
      old_ca2._M_dataplus._M_p._0_1_ =
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
           leaf1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
          leaf1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&threads);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&old_ca1,(internal *)&old_ca2,(AssertionResult *)0x507f3c,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20e0,(char *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,
                                            (char)old_ca1._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__10,(Message *)&threads);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
        std::__cxx11::string::~string((string *)&old_ca1);
        if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&old_ca2._M_string_length);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&old_ca2._M_string_length);
        TestBody::anon_class_8_1_ba1d59bf::operator()
                  ((anon_class_8_1_ba1d59bf *)&leaf2,(string *)&issue_cert);
        old_ca2._M_string_length = 0;
        old_ca2._M_dataplus._M_p._0_1_ =
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
             leaf2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
            leaf2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&threads);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&old_ca1,(internal *)&old_ca2,(AssertionResult *)0x507f46,"false","true",in_R9)
          ;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x20e2,(char *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,
                                              (char)old_ca1._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__10,(Message *)&threads);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
          std::__cxx11::string::~string((string *)&old_ca1);
          if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&old_ca2._M_string_length);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&old_ca2._M_string_length);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&old_ca1,"Test CA 1069881739",(allocator<char> *)&old_ca2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&old_ca2,"Test CA 940754110",(allocator<char> *)&threads);
          bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_root,&old_ca1,kOldHash);
          gtest_ar__10.success_ = bVar3;
          gtest_ar__10.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (bVar3) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__10.message_);
            bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_root,&old_ca2,kOldHash);
            gtest_ar__10.success_ = bVar3;
            gtest_ar__10.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&old_leaf1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar__10,
                         (AssertionResult *)"add_root(old_ca2, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&old_leaf2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20e8,(char *)threads.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&old_leaf2,(Message *)&old_leaf1);
              goto LAB_00398f87;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__10.message_);
            bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_crl,&old_ca1,-2,kOldHash);
            gtest_ar__10.success_ = bVar3;
            gtest_ar__10.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&old_leaf1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar__10,
                         (AssertionResult *)"add_crl(old_ca1, -2, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&old_leaf2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20e9,(char *)threads.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&old_leaf2,(Message *)&old_leaf1);
              goto LAB_00398f87;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__10.message_);
            bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_crl,&old_ca2,-1,kOldHash);
            gtest_ar__10.success_ = bVar3;
            gtest_ar__10.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&old_leaf1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar__10,
                         (AssertionResult *)"add_crl(old_ca2, -1, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&old_leaf2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20ea,(char *)threads.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&old_leaf2,(Message *)&old_leaf1);
              goto LAB_00398f87;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__10.message_);
            bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_crl,&old_ca2,-2,kOldHash);
            gtest_ar__10.success_ = bVar3;
            gtest_ar__10.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&old_leaf1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar__10,
                         (AssertionResult *)"add_crl(old_ca2, -2, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&old_leaf2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20eb,(char *)threads.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&old_leaf2,(Message *)&old_leaf1);
              goto LAB_00398f87;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__10.message_);
            bVar3 = TestBody::anon_class_16_2_441bd9f7::operator()(&add_crl,&old_ca1,-1,kOldHash);
            gtest_ar__10.success_ = bVar3;
            gtest_ar__10.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&old_leaf1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar__10,
                         (AssertionResult *)"add_crl(old_ca1, -1, kOldHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&old_leaf2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20ec,(char *)threads.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&old_leaf2,(Message *)&old_leaf1);
              goto LAB_00398f87;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__10.message_);
            gtest_ar__10._0_8_ = dir.next_cert_._M_t._M_impl.super__Rb_tree_header._M_node_count;
            old_leaf1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 2;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&threads,"dir.num_cert_hashes()","2u",
                       (unsigned_long *)&gtest_ar__10,(uint *)&old_leaf1);
            if ((char)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start == '\0') {
              testing::Message::Message((Message *)&gtest_ar__10);
              if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish == (pointer)0x0) {
                pcVar10 = "";
              }
              else {
                pcVar10 = (char *)((threads.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->_M_id)._M_thread;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&old_leaf1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20ee,pcVar10);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&old_leaf1,(Message *)&gtest_ar__10);
LAB_0039911a:
              this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&old_leaf1);
              if (gtest_ar__10._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
              }
              goto LAB_00398fae;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
            gtest_ar__10._0_8_ = dir.next_crl_._M_t._M_impl.super__Rb_tree_header._M_node_count;
            old_leaf1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 2;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&threads,"dir.num_crl_hashes()","2u",
                       (unsigned_long *)&gtest_ar__10,(uint *)&old_leaf1);
            if ((char)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start == '\0') {
              testing::Message::Message((Message *)&gtest_ar__10);
              if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish == (pointer)0x0) {
                pcVar10 = "";
              }
              else {
                pcVar10 = (char *)((threads.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->_M_id)._M_thread;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&old_leaf1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20ef,pcVar10);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&old_leaf1,(Message *)&gtest_ar__10);
              goto LAB_0039911a;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
            TestBody::anon_class_8_1_ba1d59bf::operator()
                      ((anon_class_8_1_ba1d59bf *)&old_leaf1,(string *)&issue_cert);
            gtest_ar__10.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            bVar3 = CONCAT44(old_leaf1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._4_4_,
                             old_leaf1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_) == 0;
            gtest_ar__10.success_ = !bVar3;
            if (bVar3) {
              testing::Message::Message((Message *)&old_leaf2);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar__10,(AssertionResult *)"old_leaf1"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&store,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20f1,(char *)threads.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&store,(Message *)&old_leaf2);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&store);
              std::__cxx11::string::~string((string *)&threads);
              if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                  old_leaf2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)old_leaf2._M_t.
                                      super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 8))();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__10.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__10.message_);
              TestBody::anon_class_8_1_ba1d59bf::operator()
                        ((anon_class_8_1_ba1d59bf *)&old_leaf2,(string *)&issue_cert);
              gtest_ar__10.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__10.success_ =
                   (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                   old_leaf2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
                   (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
              if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                  old_leaf2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
                  (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
                testing::Message::Message((Message *)&store);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&threads,(internal *)&gtest_ar__10,
                           (AssertionResult *)"old_leaf2","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&verify,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x20f3,(char *)threads.
                                           super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&verify,(Message *)&store);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&verify);
                std::__cxx11::string::~string((string *)&threads);
                if ((__uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>)
                    store._M_t.super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>)0x0) {
                  (**(code **)(*(long *)store._M_t.
                                        super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl
                              + 8))();
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__10.message_);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__10.message_);
                store._M_t.super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<x509_store_st,_bssl::internal::Deleter,_true,_true>)
                     X509_STORE_new();
                gtest_ar__10.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar__10.success_ =
                     (tuple<x509_store_st_*,_bssl::internal::Deleter>)
                     store._M_t.super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl !=
                     (_Head_base<0UL,_x509_store_st_*,_false>)0x0;
                if ((tuple<x509_store_st_*,_bssl::internal::Deleter>)
                    store._M_t.super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl ==
                    (_Head_base<0UL,_x509_store_st_*,_false>)0x0) {
                  testing::Message::Message((Message *)&verify);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&threads,(internal *)&gtest_ar__10,
                             (AssertionResult *)0x4a6850,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_178,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x20f7,(char *)threads.
                                             super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  testing::internal::AssertHelper::operator=(&local_178,(Message *)&verify);
LAB_003992c1:
                  testing::internal::AssertHelper::~AssertHelper(&local_178);
                  std::__cxx11::string::~string((string *)&threads);
                  if (verify.store != (UniquePtr<X509_STORE> *)0x0) {
                    (*(code *)((((verify.store)->_M_t).
                                super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl)->
                              objs_lock).__align)();
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar__10.message_);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar__10.message_);
                  iVar4 = X509_STORE_load_locations
                                    ((X509_STORE *)
                                     store._M_t.
                                     super___uniq_ptr_impl<x509_store_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_x509_store_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_x509_store_st_*,_false>._M_head_impl,
                                     (char *)0x0,dir.dir_.path_._M_dataplus._M_p);
                  gtest_ar__10.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar__10.success_ = iVar4 != 0;
                  if (iVar4 == 0) {
                    testing::Message::Message((Message *)&verify);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&threads,(internal *)&gtest_ar__10,
                               (AssertionResult *)
                               "X509_STORE_load_locations(store.get(), nullptr, dir.path().c_str())"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_178,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x20f9,(char *)threads.
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
                    testing::internal::AssertHelper::operator=(&local_178,(Message *)&verify);
                    goto LAB_003992c1;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar__10.message_);
                  verify.store = &store;
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_f0 = 10;
                  __args = extraout_RDX;
                  while (ptVar1 = threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_finish, bVar3 = local_f0 != 0,
                        local_f0 = local_f0 + -1,
                        ptVar9 = threads.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_start, bVar3) {
                    gtest_ar__10._0_8_ = &verify;
                    gtest_ar__10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )&leaf1;
                    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                        (&threads,1,"vector::_M_realloc_insert");
                      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::
                               _M_allocate(&threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ,sVar6);
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__0>
                                ((allocator_type *)(((long)ptVar1 - (long)ptVar9) + (long)ptVar7),
                                 (thread *)&gtest_ar__10,__args_00);
                      ptVar8 = std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         (ptVar9,ptVar1,ptVar7,(allocator<std::thread> *)&threads);
                      paVar5 = (allocator_type *)
                               std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         (ptVar1,ptVar2,ptVar8 + 1,
                                          (allocator<std::thread> *)&threads);
                      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads
                                 ,ptVar9,(long)threads.
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)ptVar9 >> 3);
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
                      __args_01 = extraout_RDX_01;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start = ptVar7;
                    }
                    else {
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__0>
                                ((allocator_type *)
                                 threads.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(thread *)&gtest_ar__10,
                                 __args);
                      paVar5 = (allocator_type *)
                               (threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
                      __args_01 = extraout_RDX_00;
                    }
                    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    gtest_ar__10._0_8_ = &verify;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)paVar5;
                    if (paVar5 == (allocator_type *)
                                  threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      gtest_ar__10.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )&leaf1;
                      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                        (&threads,1,"vector::_M_realloc_insert");
                      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::
                               _M_allocate(&threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ,sVar6);
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__1>
                                ((allocator_type *)(((long)ptVar1 - (long)ptVar9) + (long)ptVar7),
                                 (thread *)&gtest_ar__10,__args_02);
                      ptVar8 = std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         (ptVar9,(thread *)paVar5,ptVar7,
                                          (allocator<std::thread> *)&threads);
                      paVar5 = (allocator_type *)
                               std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         ((thread *)paVar5,ptVar2,ptVar8 + 1,
                                          (allocator<std::thread> *)&threads);
                      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads
                                 ,ptVar9,(long)threads.
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)ptVar9 >> 3);
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
                      __args_03 = extraout_RDX_03;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start = ptVar7;
                    }
                    else {
                      gtest_ar__10.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )&leaf1;
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__1>
                                (paVar5,(thread *)&gtest_ar__10,__args_01);
                      paVar5 = (allocator_type *)
                               (threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
                      __args_03 = extraout_RDX_02;
                    }
                    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    gtest_ar__10._0_8_ = &verify;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)paVar5;
                    gtest_ar__10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )&leaf2;
                    if (paVar5 == (allocator_type *)
                                  threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                        (&threads,1,"vector::_M_realloc_insert");
                      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::
                               _M_allocate(&threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ,sVar6);
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__2>
                                ((allocator_type *)(((long)ptVar1 - (long)ptVar9) + (long)ptVar7),
                                 (thread *)&gtest_ar__10,__args_04);
                      ptVar8 = std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         (ptVar9,(thread *)paVar5,ptVar7,
                                          (allocator<std::thread> *)&threads);
                      paVar5 = (allocator_type *)
                               std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         ((thread *)paVar5,ptVar2,ptVar8 + 1,
                                          (allocator<std::thread> *)&threads);
                      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads
                                 ,ptVar9,(long)threads.
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)ptVar9 >> 3);
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
                      __args_05 = extraout_RDX_05;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start = ptVar7;
                    }
                    else {
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__2>
                                (paVar5,(thread *)&gtest_ar__10,__args_03);
                      paVar5 = (allocator_type *)
                               (threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
                      __args_05 = extraout_RDX_04;
                    }
                    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    gtest_ar__10._0_8_ = &verify;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)paVar5;
                    if (paVar5 == (allocator_type *)
                                  threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      gtest_ar__10.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )&leaf2;
                      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                        (&threads,1,"vector::_M_realloc_insert");
                      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::
                               _M_allocate(&threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ,sVar6);
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__3>
                                ((allocator_type *)(((long)ptVar1 - (long)ptVar9) + (long)ptVar7),
                                 (thread *)&gtest_ar__10,__args_06);
                      ptVar8 = std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         (ptVar9,(thread *)paVar5,ptVar7,
                                          (allocator<std::thread> *)&threads);
                      paVar5 = (allocator_type *)
                               std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         ((thread *)paVar5,ptVar2,ptVar8 + 1,
                                          (allocator<std::thread> *)&threads);
                      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads
                                 ,ptVar9,(long)threads.
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)ptVar9 >> 3);
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
                      __args_07 = extraout_RDX_07;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start = ptVar7;
                    }
                    else {
                      gtest_ar__10.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )&leaf2;
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__3>
                                (paVar5,(thread *)&gtest_ar__10,__args_05);
                      paVar5 = (allocator_type *)
                               (threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
                      __args_07 = extraout_RDX_06;
                    }
                    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    gtest_ar__10._0_8_ = &verify;
                    gtest_ar__10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )&old_leaf1;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)paVar5;
                    if (paVar5 == (allocator_type *)
                                  threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                        (&threads,1,"vector::_M_realloc_insert");
                      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::
                               _M_allocate(&threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ,sVar6);
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__4>
                                ((allocator_type *)(((long)ptVar1 - (long)ptVar9) + (long)ptVar7),
                                 (thread *)&gtest_ar__10,__args_08);
                      ptVar8 = std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         (ptVar9,(thread *)paVar5,ptVar7,
                                          (allocator<std::thread> *)&threads);
                      paVar5 = (allocator_type *)
                               std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         ((thread *)paVar5,ptVar2,ptVar8 + 1,
                                          (allocator<std::thread> *)&threads);
                      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads
                                 ,ptVar9,(long)threads.
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)ptVar9 >> 3);
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
                      __args_09 = extraout_RDX_09;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start = ptVar7;
                    }
                    else {
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__4>
                                (paVar5,(thread *)&gtest_ar__10,__args_07);
                      paVar5 = (allocator_type *)
                               (threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
                      __args_09 = extraout_RDX_08;
                    }
                    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    gtest_ar__10._0_8_ = &verify;
                    gtest_ar__10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )&old_leaf1;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)paVar5;
                    if (paVar5 == (allocator_type *)
                                  threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                        (&threads,1,"vector::_M_realloc_insert");
                      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::
                               _M_allocate(&threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ,sVar6);
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__5>
                                ((allocator_type *)(((long)ptVar1 - (long)ptVar9) + (long)ptVar7),
                                 (thread *)&gtest_ar__10,__args_10);
                      ptVar8 = std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         (ptVar9,(thread *)paVar5,ptVar7,
                                          (allocator<std::thread> *)&threads);
                      paVar5 = (allocator_type *)
                               std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         ((thread *)paVar5,ptVar2,ptVar8 + 1,
                                          (allocator<std::thread> *)&threads);
                      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads
                                 ,ptVar9,(long)threads.
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)ptVar9 >> 3);
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
                      __args_11 = extraout_RDX_11;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start = ptVar7;
                    }
                    else {
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__5>
                                (paVar5,(thread *)&gtest_ar__10,__args_09);
                      paVar5 = (allocator_type *)
                               (threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
                      __args_11 = extraout_RDX_10;
                    }
                    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    gtest_ar__10._0_8_ = &verify;
                    gtest_ar__10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )&old_leaf2;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)paVar5;
                    if (paVar5 == (allocator_type *)
                                  threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                        (&threads,1,"vector::_M_realloc_insert");
                      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::
                               _M_allocate(&threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ,sVar6);
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__6>
                                ((allocator_type *)(((long)ptVar1 - (long)ptVar9) + (long)ptVar7),
                                 (thread *)&gtest_ar__10,__args_12);
                      ptVar8 = std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         (ptVar9,(thread *)paVar5,ptVar7,
                                          (allocator<std::thread> *)&threads);
                      paVar5 = (allocator_type *)
                               std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         ((thread *)paVar5,ptVar2,ptVar8 + 1,
                                          (allocator<std::thread> *)&threads);
                      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads
                                 ,ptVar9,(long)threads.
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)ptVar9 >> 3);
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
                      __args_13 = extraout_RDX_13;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start = ptVar7;
                    }
                    else {
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__6>
                                (paVar5,(thread *)&gtest_ar__10,__args_11);
                      paVar5 = (allocator_type *)
                               (threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
                      __args_13 = extraout_RDX_12;
                    }
                    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    gtest_ar__10._0_8_ = &verify;
                    gtest_ar__10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )&old_leaf2;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)paVar5;
                    if (paVar5 == (allocator_type *)
                                  threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                        (&threads,1,"vector::_M_realloc_insert");
                      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      ptVar7 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::
                               _M_allocate(&threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ,sVar6);
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__7>
                                ((allocator_type *)(((long)ptVar1 - (long)ptVar9) + (long)ptVar7),
                                 (thread *)&gtest_ar__10,__args_14);
                      ptVar8 = std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         (ptVar9,(thread *)paVar5,ptVar7,
                                          (allocator<std::thread> *)&threads);
                      ptVar8 = std::
                               __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                         ((thread *)paVar5,ptVar2,ptVar8 + 1,
                                          (allocator<std::thread> *)&threads);
                      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads
                                 ,ptVar9,(long)threads.
                                               super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)ptVar9 >> 3);
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = ptVar7 + sVar6;
                      __args = extraout_RDX_15;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start = ptVar7;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish = ptVar8;
                    }
                    else {
                      std::allocator_traits<std::allocator<std::thread>>::
                      construct<std::thread,(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__7>
                                (paVar5,(thread *)&gtest_ar__10,__args_13);
                      __args = extraout_RDX_14;
                      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  for (; ptVar9 != ptVar1; ptVar9 = ptVar9 + 1) {
                    std::thread::join();
                  }
                  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
                }
                std::unique_ptr<x509_store_st,_bssl::internal::Deleter>::~unique_ptr(&store);
              }
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&old_leaf2);
            }
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&old_leaf1);
          }
          else {
            testing::Message::Message((Message *)&old_leaf1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&threads,(internal *)&gtest_ar__10,
                       (AssertionResult *)"add_root(old_ca1, kOldHash)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&old_leaf2,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x20e7,(char *)threads.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&old_leaf2,(Message *)&old_leaf1);
LAB_00398f87:
            this_01 = &gtest_ar__10.message_;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&old_leaf2);
            std::__cxx11::string::~string((string *)&threads);
            if ((long *)CONCAT44(old_leaf1._M_t.
                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._4_4_,
                                 old_leaf1._M_t.
                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_) !=
                (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(old_leaf1._M_t.
                                             super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl.
                                             _4_4_,old_leaf1._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) + 8))();
            }
LAB_00398fae:
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(this_01);
          }
          std::__cxx11::string::~string((string *)&old_ca2);
          std::__cxx11::string::~string((string *)&old_ca1);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&leaf2);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&leaf1);
    }
    else {
      testing::Message::Message((Message *)&threads);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&old_ca1,(internal *)&old_ca2,(AssertionResult *)"add_root(ca1, kNewHash)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x20d6,(char *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,
                                          (char)old_ca1._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__10,(Message *)&threads);
LAB_00398aed:
      this_00 = &old_ca2._M_string_length;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
      std::__cxx11::string::~string((string *)&old_ca1);
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_start)->_M_id)._M_thread + 8))();
      }
LAB_00398b14:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
    }
    std::__cxx11::string::~string((string *)&ca2);
    std::__cxx11::string::~string((string *)&ca1);
  }
  else {
    testing::Message::Message((Message *)&old_ca1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&ca1,(internal *)&ca2,(AssertionResult *)"dir.Init()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&old_ca2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20b7,(char *)CONCAT71(ca1._M_dataplus._M_p._1_7_,ca1._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&old_ca2,(Message *)&old_ca1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&old_ca2);
    std::__cxx11::string::~string((string *)&ca1);
    if ((long *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,(char)old_ca1._M_dataplus._M_p) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(old_ca1._M_dataplus._M_p._1_7_,(char)old_ca1._M_dataplus._M_p)
                  + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ca2._M_string_length);
  }
  TemporaryHashDir::~TemporaryHashDir(&dir);
LAB_00398b40:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST(X509Test, DirHashThreads) {
  if (bssl::SkipTempFileTests()) {
    GTEST_SKIP();
  }

  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  // Generate some roots and fill a directory with OpenSSL's directory hash
  // format. The hash depends only on the name, so we do not need to
  // pre-generate the certificates. Test both DER and PEM.
  TemporaryHashDir dir(X509_FILETYPE_PEM);
  ASSERT_TRUE(dir.Init());

  auto add_root = [&](const std::string &name, NameHash name_hash) -> bool {
    bssl::UniquePtr<X509> ca =
        MakeTestCert(name.c_str(), name.c_str(), key.get(), /*is_ca=*/true);
    return ca != nullptr &&  //
           X509_sign(ca.get(), key.get(), EVP_sha256()) &&
           dir.AddCert(ca.get(), name_hash);
  };

  auto issue_cert = [&](const std::string &issuer) -> bssl::UniquePtr<X509> {
    bssl::UniquePtr<X509> cert =
        MakeTestCert(issuer.c_str(), "Leaf", key.get(), /*is_ca=*/false);
    if (cert == nullptr || !X509_sign(cert.get(), key.get(), EVP_sha256())) {
      return nullptr;
    }
    return cert;
  };

  auto add_crl = [&](const std::string &name, int this_update_offset_day,
                     NameHash name_hash) -> bool {
    bssl::UniquePtr<X509_CRL> crl = MakeTestCRL(
        name.c_str(), this_update_offset_day, /*next_update_offset_day=*/1);
    return crl != nullptr &&
           X509_CRL_sign(crl.get(), key.get(), EVP_sha256()) &&
           dir.AddCRL(crl.get(), name_hash);
  };

  // These two CAs collide under |X509_NAME_hash|.
  std::string ca1 = "Test CA 1191514847";
  std::string ca2 = "Test CA 1570301806";
  ASSERT_TRUE(add_root(ca1, kNewHash));
  ASSERT_TRUE(add_root(ca2, kNewHash));
  ASSERT_TRUE(add_crl(ca1, -2, kNewHash));
  ASSERT_TRUE(add_crl(ca2, -1, kNewHash));
  ASSERT_TRUE(add_crl(ca2, -2, kNewHash));
  ASSERT_TRUE(add_crl(ca1, -1, kNewHash));
  // Verify the hashes collided.
  ASSERT_EQ(dir.num_cert_hashes(), 1u);
  ASSERT_EQ(dir.num_crl_hashes(), 1u);
  bssl::UniquePtr<X509> leaf1 = issue_cert(ca1);
  ASSERT_TRUE(leaf1);
  bssl::UniquePtr<X509> leaf2 = issue_cert(ca2);
  ASSERT_TRUE(leaf2);

  // These two CAs collide under |X509_NAME_hash_old|.
  std::string old_ca1 = "Test CA 1069881739";
  std::string old_ca2 = "Test CA 940754110";
  ASSERT_TRUE(add_root(old_ca1, kOldHash));
  ASSERT_TRUE(add_root(old_ca2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca1, -2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca2, -1, kOldHash));
  ASSERT_TRUE(add_crl(old_ca2, -2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca1, -1, kOldHash));
  // Verify the hashes collided.
  ASSERT_EQ(dir.num_cert_hashes(), 2u);
  ASSERT_EQ(dir.num_crl_hashes(), 2u);
  bssl::UniquePtr<X509> old_leaf1 = issue_cert(old_ca1);
  ASSERT_TRUE(old_leaf1);
  bssl::UniquePtr<X509> old_leaf2 = issue_cert(old_ca2);
  ASSERT_TRUE(old_leaf2);

  // Make an |X509_STORE| that gets CAs from |dir|.
  bssl::UniquePtr<X509_STORE> store(X509_STORE_new());
  ASSERT_TRUE(store);
  ASSERT_TRUE(X509_STORE_load_locations(store.get(), /*file=*/nullptr,
                                        dir.path().c_str()));

  auto verify = [&](X509 *cert, bool crl_check) {
    bssl::UniquePtr<X509_STORE_CTX> ctx(X509_STORE_CTX_new());
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(X509_STORE_CTX_init(ctx.get(), store.get(), cert,
                                    /*chain=*/nullptr));
    X509_STORE_CTX_set_flags(ctx.get(), crl_check ? X509_V_FLAG_CRL_CHECK : 0);
    X509_STORE_CTX_set_time_posix(ctx.get(), /*flags=*/0, kReferenceTime);
    EXPECT_TRUE(X509_verify_cert(ctx.get()))
        << X509_verify_cert_error_string(X509_STORE_CTX_get_error(ctx.get()));
  };

  const size_t kNumThreads = 10;
  std::vector<std::thread> threads;
  for (size_t i = 0; i < kNumThreads; i++) {
    threads.emplace_back([&] { verify(leaf1.get(), false); });
    threads.emplace_back([&] { verify(leaf1.get(), true); });
    threads.emplace_back([&] { verify(leaf2.get(), false); });
    threads.emplace_back([&] { verify(leaf2.get(), true); });

    threads.emplace_back([&] { verify(old_leaf1.get(), false); });
    threads.emplace_back([&] { verify(old_leaf1.get(), true); });
    threads.emplace_back([&] { verify(old_leaf2.get(), false); });
    threads.emplace_back([&] { verify(old_leaf2.get(), true); });
  }
  for (auto &thread : threads) {
    thread.join();
  }
}